

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampler_test.cc
# Opt level: O3

void __thiscall SamplerTest_size_of_class_Test::TestBody(SamplerTest_size_of_class_Test *this)

{
  undefined1 auStack_38 [8];
  Sampler sampler;
  
  auStack_38 = (undefined1  [8])0x0;
  sampler.bytes_until_sample_ = 0;
  sampler.rnd_._0_1_ = 0;
  tcmalloc::Sampler::Init((Sampler *)auStack_38,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Size of Sampler class is: ",0x1a);
  std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Size of Sampler object is: ",0x1b);
  std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  return;
}

Assistant:

TEST_F(SamplerTest, size_of_class) {
  tcmalloc::Sampler sampler;
  sampler.Init(1);
  LOG(INFO) << "Size of Sampler class is: " << sizeof(tcmalloc::Sampler);
  LOG(INFO) << "Size of Sampler object is: " << sizeof(sampler);
}